

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlUnknown *unknown)

{
  char *suffix;
  TiXmlUnknown *unknown_local;
  TiXmlPrinter *this_local;
  
  DoIndent(this);
  TiXmlString::operator+=(&this->buffer,"<");
  suffix = TiXmlNode::Value(&unknown->super_TiXmlNode);
  TiXmlString::operator+=(&this->buffer,suffix);
  TiXmlString::operator+=(&this->buffer,">");
  DoLineBreak(this);
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlUnknown& unknown) {
	DoIndent();
	buffer += "<";
	buffer += unknown.Value();
	buffer += ">";
	DoLineBreak();
	return true;
}